

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::terminatingError(string *message)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this;
  ostream *poVar1;
  int __how;
  function<void_()> local_60;
  type func;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,(string *)message);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  this = &func._M_bound_args.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ;
  func._M_f = anon_unknown_1::buildErrorUI;
  func._M_bound_args.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl =
       (_Head_base<1UL,_bool,_false>)true;
  std::__cxx11::string::string((string *)this,(string *)message);
  std::function<void()>::
  function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
            ((function<void()> *)&local_60,&func);
  __how = 0;
  pushContext(&local_60,false);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  shutdown(-1,__how);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void terminatingError(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  auto func = std::bind(buildErrorUI, message, true);
  pushContext(func, false);

  // Quit the program
  shutdown(-1);
}